

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateDSTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::DynamicState::anon_unknown_0::StencilParamsBasicTestInstance::iterate
          (TestStatus *__return_storage_ptr__,StencilParamsBasicTestInstance *this)

{
  Context *this_00;
  DeviceInterface *pDVar1;
  Image *this_01;
  TestStatus *pTVar2;
  bool bVar3;
  VkResult result;
  VkQueue pVVar4;
  Allocator *allocator;
  deUint32 height;
  int y;
  deUint32 width;
  int x;
  double dVar6;
  float fVar7;
  long *local_168;
  long local_160;
  long local_158 [2];
  float local_144;
  undefined8 local_140;
  undefined4 local_138;
  TestStatus *local_130;
  TestLog *local_128;
  VkQueue local_120;
  double local_118;
  double local_110;
  VkBuffer vertexBuffer;
  VkDeviceSize vertexBufferOffset;
  Texture2D referenceFrame;
  ConstPixelBufferAccess renderedFrame;
  VkSubmitInfo submitInfo;
  StencilParamsBasicTestInstance *pSVar5;
  
  this_00 = (this->super_DepthStencilBaseCase).super_TestInstance.m_context;
  local_128 = this_00->m_testCtx->m_log;
  pSVar5 = this;
  local_130 = __return_storage_ptr__;
  pVVar4 = Context::getUniversalQueue(this_00);
  width = (deUint32)pSVar5;
  DepthStencilBaseCase::beginRenderPass(&this->super_DepthStencilBaseCase);
  DepthStencilBaseCase::setDynamicViewportState(&this->super_DepthStencilBaseCase,width,height);
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x4f])
            (0x3f800000,pDVar1,
             (this->super_DepthStencilBaseCase).m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.
             m_data.object);
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x50])
            (0,0,0,pDVar1,
             (this->super_DepthStencilBaseCase).m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.
             m_data.object);
  referenceFrame.super_TextureLevelPyramid.m_format.order = R;
  referenceFrame.super_TextureLevelPyramid.m_format.type = SNORM_INT8;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x51])
            (pDVar1,(this->super_DepthStencilBaseCase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  vertexBuffer.m_internal =
       (((this->super_DepthStencilBaseCase).m_vertexBuffer.m_ptr)->m_object).
       super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x58])
            (pDVar1,(this->super_DepthStencilBaseCase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,1);
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x4c])
            (pDVar1,(this->super_DepthStencilBaseCase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,
             (this->super_DepthStencilBaseCase).m_pipeline_1.
             super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  DepthStencilBaseCase::setDynamicDepthStencilState
            (&this->super_DepthStencilBaseCase,-1.0,1.0,0xff,this->m_writeMask,0xf,0xff,
             this->m_writeMask,0xf);
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x59])
            (pDVar1,(this->super_DepthStencilBaseCase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,4,1,0,0);
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x4c])
            (pDVar1,(this->super_DepthStencilBaseCase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,
             (this->super_DepthStencilBaseCase).m_pipeline_2.
             super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  DepthStencilBaseCase::setDynamicDepthStencilState
            (&this->super_DepthStencilBaseCase,-1.0,1.0,this->m_readMask,0xff,this->m_expectedValue,
             this->m_readMask,0xff,this->m_expectedValue);
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x59])
            (pDVar1,(this->super_DepthStencilBaseCase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,4,1,4,0);
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x76])
            (pDVar1,(this->super_DepthStencilBaseCase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x4a])
            (pDVar1,(this->super_DepthStencilBaseCase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  (*pDVar1->_vptr_DeviceInterface[2])(pDVar1,pVVar4,1);
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  local_120 = pVVar4;
  result = (*pDVar1->_vptr_DeviceInterface[3])(pDVar1,pVVar4);
  ::vk::checkResult(result,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/dynamic_state/vktDynamicStateDSTests.cpp"
                    ,0x27a);
  renderedFrame.m_format =
       ::vk::mapVkFormat((this->super_DepthStencilBaseCase).m_colorAttachmentFormat);
  tcu::Texture2D::Texture2D(&referenceFrame,&renderedFrame.m_format,0x80,0x80);
  tcu::Texture2D::allocLevel(&referenceFrame,0);
  if (0 < referenceFrame.m_height) {
    local_118 = (double)referenceFrame.m_height * 0.5;
    dVar6 = (double)referenceFrame.m_width * 0.5;
    y = 0;
    local_110 = dVar6;
    do {
      if (0 < referenceFrame.m_width) {
        fVar7 = (float)((double)y / local_118) + -1.0;
        x = 0;
        local_144 = fVar7;
        do {
          if (((fVar7 <= 1.0) && (-1.0 <= fVar7)) && (ABS((float)((double)x / dVar6) + -1.0) <= 1.0)
             ) {
            tcu::PixelBufferAccess::setPixel
                      (referenceFrame.super_TextureLevelPyramid.m_access.
                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                       ._M_impl.super__Vector_impl_data._M_start,&this->m_expectedColor,x,y,0);
            dVar6 = local_110;
            fVar7 = local_144;
          }
          x = x + 1;
        } while (referenceFrame.m_width != x);
      }
      y = y + 1;
    } while (y != referenceFrame.m_height);
  }
  this_01 = (this->super_DepthStencilBaseCase).m_colorTargetImage.m_ptr;
  allocator = Context::getDefaultAllocator
                        ((this->super_DepthStencilBaseCase).super_TestInstance.m_context);
  local_138 = 0;
  local_140 = 0;
  Draw::Image::readSurface
            (&renderedFrame,this_01,local_120,allocator,VK_IMAGE_LAYOUT_GENERAL,
             (VkOffset3D)(ZEXT412(0) << 0x40),0x80,0x80,VK_IMAGE_ASPECT_COLOR_BIT,0,0);
  bVar3 = tcu::fuzzyCompare(local_128,"Result","Image comparison result",
                            &(referenceFrame.super_TextureLevelPyramid.m_access.
                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                             super_ConstPixelBufferAccess,&renderedFrame,0.05,COMPARE_LOG_RESULT);
  pTVar2 = local_130;
  local_168 = local_158;
  if (bVar3) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_168,"Image verification passed","");
    pTVar2->m_code = QP_TEST_RESULT_PASS;
    (pTVar2->m_description)._M_dataplus._M_p = (pointer)&(pTVar2->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar2->m_description,local_168,local_160 + (long)local_168);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_168,"Image verification failed","");
    pTVar2->m_code = QP_TEST_RESULT_FAIL;
    (pTVar2->m_description)._M_dataplus._M_p = (pointer)&(pTVar2->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar2->m_description,local_168,local_160 + (long)local_168);
  }
  if (local_168 != local_158) {
    operator_delete(local_168,local_158[0] + 1);
  }
  tcu::Texture3D::~Texture3D((Texture3D *)&referenceFrame);
  return pTVar2;
}

Assistant:

virtual tcu::TestStatus iterate (void)
	{
		tcu::TestLog &log = m_context.getTestContext().getLog();
		const vk::VkQueue queue = m_context.getUniversalQueue();

		beginRenderPass();

		// set states here
		setDynamicViewportState(WIDTH, HEIGHT);
		setDynamicRasterizationState();
		setDynamicBlendState();

		const vk::VkDeviceSize vertexBufferOffset = 0;
		const vk::VkBuffer vertexBuffer = m_vertexBuffer->object();
		m_vk.cmdBindVertexBuffers(*m_cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);

		m_vk.cmdBindPipeline(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline_1);
		setDynamicDepthStencilState(-1.0f, 1.0f, 0xFF, m_writeMask, 0x0F, 0xFF, m_writeMask, 0x0F);
		m_vk.cmdDraw(*m_cmdBuffer, 4, 1, 0, 0);

		m_vk.cmdBindPipeline(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline_2);
		setDynamicDepthStencilState(-1.0f, 1.0f, m_readMask, 0xFF, m_expectedValue, m_readMask, 0xFF, m_expectedValue);
		m_vk.cmdDraw(*m_cmdBuffer, 4, 1, 4, 0);

		m_vk.cmdEndRenderPass(*m_cmdBuffer);
		m_vk.endCommandBuffer(*m_cmdBuffer);

		vk::VkSubmitInfo submitInfo =
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
			DE_NULL,							// const void*				pNext;
			0,									// deUint32					waitSemaphoreCount;
			DE_NULL,							// const VkSemaphore*		pWaitSemaphores;
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1,									// deUint32					commandBufferCount;
			&m_cmdBuffer.get(),					// const VkCommandBuffer*	pCommandBuffers;
			0,									// deUint32					signalSemaphoreCount;
			DE_NULL								// const VkSemaphore*		pSignalSemaphores;
		};
		m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL);

		// validation
		{
			VK_CHECK(m_vk.queueWaitIdle(queue));

			tcu::Texture2D referenceFrame(vk::mapVkFormat(m_colorAttachmentFormat), (int)(0.5 + WIDTH), (int)(0.5 + HEIGHT));
			referenceFrame.allocLevel(0);

			const deInt32 frameWidth = referenceFrame.getWidth();
			const deInt32 frameHeight = referenceFrame.getHeight();

			for (int y = 0; y < frameHeight; y++)
			{
				const float yCoord = (float)(y / (0.5*frameHeight)) - 1.0f;

				for (int x = 0; x < frameWidth; x++)
				{
					const float xCoord = (float)(x / (0.5*frameWidth)) - 1.0f;

					if (xCoord >= -1.0f && xCoord <= 1.0f && yCoord >= -1.0f && yCoord <= 1.0f)
						referenceFrame.getLevel(0).setPixel(m_expectedColor, x, y);
				}
			}

			const vk::VkOffset3D zeroOffset = { 0, 0, 0 };
			const tcu::ConstPixelBufferAccess renderedFrame = m_colorTargetImage->readSurface(queue, m_context.getDefaultAllocator(),
				vk::VK_IMAGE_LAYOUT_GENERAL, zeroOffset, WIDTH, HEIGHT, vk::VK_IMAGE_ASPECT_COLOR_BIT);

			if (!tcu::fuzzyCompare(log, "Result", "Image comparison result",
				referenceFrame.getLevel(0), renderedFrame, 0.05f,
				tcu::COMPARE_LOG_RESULT))
			{
				return tcu::TestStatus(QP_TEST_RESULT_FAIL, "Image verification failed");
			}

			return tcu::TestStatus(QP_TEST_RESULT_PASS, "Image verification passed");
		}
	}